

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_619fee::OptionBuilder::add(OptionBuilder *this,CoverageOptionSyntax *syntax)

{
  char *pcVar1;
  Scope *this_00;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint64_t hash;
  Diagnostic *this_01;
  SourceLocation noteLocation;
  byte bVar5;
  ulong pos0;
  not_null<slang::syntax::ExpressionSyntax_*> *args_2;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *this_02;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::SyntaxNode_*>,_96UL,_16UL>_>
  *pSVar10;
  undefined1 auVar11 [16];
  char cVar12;
  char cVar13;
  char cVar14;
  byte bVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  byte bVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  byte bVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  byte bVar27;
  SourceRange sourceRange;
  string_view name;
  try_emplace_args_t local_b9;
  string_view local_b8;
  not_null<slang::syntax::ExpressionSyntax_*> *local_a8;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *local_a0;
  long local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  uint64_t local_70;
  char local_68;
  char cStack_67;
  char cStack_66;
  byte bStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  byte bStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  byte bStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  byte bStack_59;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  Token local_48;
  
  slang::SmallVectorBase<slang::ast::CoverageOptionSetter>::
  emplace_back<slang::ast::Scope_const&,slang::syntax::CoverageOptionSyntax_const&>
            (&(this->options).super_SmallVectorBase<slang::ast::CoverageOptionSetter>,this->scope,
             syntax);
  local_b8 = slang::ast::CoverageOptionSetter::getName
                       ((this->options).super_SmallVectorBase<slang::ast::CoverageOptionSetter>.
                        data_ + ((this->options).
                                 super_SmallVectorBase<slang::ast::CoverageOptionSetter>.len - 1));
  if (local_b8._M_len != 0) {
    bVar3 = slang::ast::CoverageOptionSetter::isTypeOption
                      ((this->options).super_SmallVectorBase<slang::ast::CoverageOptionSetter>.data_
                       + ((this->options).super_SmallVectorBase<slang::ast::CoverageOptionSetter>.
                          len - 1));
    pSVar10 = &this->instNames;
    if (bVar3) {
      pSVar10 = &this->typeNames;
    }
    this_02 = (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
              &(pSVar10->super_Storage).field_0x68;
    args_2 = &syntax->expr;
    hash = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_02,
                      &local_b8);
    pos0 = hash >> (pSVar10->field_0x70 & 0x3f);
    lVar8 = (hash & 0xff) * 4;
    cVar12 = (&UNK_0042856c)[lVar8];
    cVar13 = (&UNK_0042856d)[lVar8];
    cVar14 = (&UNK_0042856e)[lVar8];
    bVar15 = (&UNK_0042856f)[lVar8];
    uVar6 = (ulong)((uint)hash & 7);
    uVar7 = 0;
    uVar9 = pos0;
    cVar16 = cVar12;
    cVar17 = cVar13;
    cVar18 = cVar14;
    bVar19 = bVar15;
    cVar20 = cVar12;
    cVar21 = cVar13;
    cVar22 = cVar14;
    bVar23 = bVar15;
    cVar24 = cVar12;
    cVar25 = cVar13;
    cVar26 = cVar14;
    bVar27 = bVar15;
    do {
      pcVar1 = (char *)(*(long *)&pSVar10->field_0x80 + uVar9 * 0x10);
      local_58 = *pcVar1;
      cStack_57 = pcVar1[1];
      cStack_56 = pcVar1[2];
      bStack_55 = pcVar1[3];
      cStack_54 = pcVar1[4];
      cStack_53 = pcVar1[5];
      cStack_52 = pcVar1[6];
      bStack_51 = pcVar1[7];
      cStack_50 = pcVar1[8];
      cStack_4f = pcVar1[9];
      cStack_4e = pcVar1[10];
      bStack_4d = pcVar1[0xb];
      cStack_4c = pcVar1[0xc];
      cStack_4b = pcVar1[0xd];
      cStack_4a = pcVar1[0xe];
      bVar5 = pcVar1[0xf];
      auVar11[0] = -(local_58 == cVar12);
      auVar11[1] = -(cStack_57 == cVar13);
      auVar11[2] = -(cStack_56 == cVar14);
      auVar11[3] = -(bStack_55 == bVar15);
      auVar11[4] = -(cStack_54 == cVar16);
      auVar11[5] = -(cStack_53 == cVar17);
      auVar11[6] = -(cStack_52 == cVar18);
      auVar11[7] = -(bStack_51 == bVar19);
      auVar11[8] = -(cStack_50 == cVar20);
      auVar11[9] = -(cStack_4f == cVar21);
      auVar11[10] = -(cStack_4e == cVar22);
      auVar11[0xb] = -(bStack_4d == bVar23);
      auVar11[0xc] = -(cStack_4c == cVar24);
      auVar11[0xd] = -(cStack_4b == cVar25);
      auVar11[0xe] = -(cStack_4a == cVar26);
      auVar11[0xf] = -(bVar5 == bVar27);
      uVar4 = (uint)(ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe);
      bStack_49 = bVar5;
      if (uVar4 != 0) {
        local_98 = *(long *)&pSVar10->field_0x80 + uVar9 * 0x10;
        lVar8 = *(long *)&pSVar10->field_0x88;
        local_a8 = args_2;
        local_a0 = this_02;
        local_90 = pos0;
        local_88 = uVar9;
        local_80 = uVar7;
        local_78 = uVar6;
        local_70 = hash;
        local_68 = cVar12;
        cStack_67 = cVar13;
        cStack_66 = cVar14;
        bStack_65 = bVar15;
        cStack_64 = cVar16;
        cStack_63 = cVar17;
        cStack_62 = cVar18;
        bStack_61 = bVar19;
        cStack_60 = cVar20;
        cStack_5f = cVar21;
        cStack_5e = cVar22;
        bStack_5d = bVar23;
        cStack_5c = cVar24;
        cStack_5b = cVar25;
        cStack_5a = cVar26;
        bStack_59 = bVar27;
        do {
          uVar2 = 0;
          if (uVar4 != 0) {
            for (; (uVar4 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
            }
          }
          __y = (basic_string_view<char,_std::char_traits<char>_> *)
                ((ulong)uVar2 * 0x18 + lVar8 + uVar9 * 0x168);
          bVar3 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            (local_a0,&local_b8,__y);
          if (bVar3) {
            this_00 = this->scope;
            sourceRange = slang::syntax::SyntaxNode::sourceRange(&local_a8->ptr->super_SyntaxNode);
            this_01 = slang::ast::Scope::addDiag(this_00,(DiagCode)0x220006,sourceRange);
            slang::Diagnostic::operator<<(this_01,local_b8);
            local_48 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)__y[1]._M_len);
            noteLocation = slang::parsing::Token::location(&local_48);
            slang::Diagnostic::addNote(this_01,(DiagCode)0xc0001,noteLocation);
            return;
          }
          uVar4 = uVar4 - 1 & uVar4;
        } while (uVar4 != 0);
        bVar5 = *(byte *)(local_98 + 0xf);
        hash = local_70;
        pos0 = local_90;
        args_2 = local_a8;
        this_02 = local_a0;
        uVar6 = local_78;
        uVar7 = local_80;
        uVar9 = local_88;
        cVar12 = local_68;
        cVar13 = cStack_67;
        cVar14 = cStack_66;
        bVar15 = bStack_65;
        cVar16 = cStack_64;
        cVar17 = cStack_63;
        cVar18 = cStack_62;
        bVar19 = bStack_61;
        cVar20 = cStack_60;
        cVar21 = cStack_5f;
        cVar22 = cStack_5e;
        bVar23 = bStack_5d;
        cVar24 = cStack_5c;
        cVar25 = cStack_5b;
        cVar26 = cStack_5a;
        bVar27 = bStack_59;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar6] & bVar5) == 0) break;
      lVar8 = uVar9 + uVar7;
      uVar7 = uVar7 + 1;
      uVar9 = lVar8 + 1U & *(ulong *)&pSVar10->field_0x78;
    } while (uVar7 <= *(ulong *)&pSVar10->field_0x78);
    if (*(ulong *)&pSVar10->field_0x98 < *(ulong *)&pSVar10->field_0x90) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxNode_const*>,96ul,16ul>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::not_null<slang::syntax::ExpressionSyntax*>const&>
                ((locator *)&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxNode_const*>,96ul,16ul>>
                  *)this_02,pos0,hash,&local_b9,&local_b8,args_2);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxNode_const*>,96ul,16ul>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::not_null<slang::syntax::ExpressionSyntax*>const&>
                ((locator *)&local_48,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::SyntaxNode_const*>,96ul,16ul>>
                  *)this_02,hash,&local_b9,&local_b8,args_2);
    }
  }
  return;
}

Assistant:

void add(const CoverageOptionSyntax& syntax) {
        options.emplace_back(scope, syntax);

        if (auto name = options.back().getName(); !name.empty()) {
            auto names = options.back().isTypeOption() ? &typeNames : &instNames;
            auto [it, inserted] = names->emplace(name, syntax.expr);
            if (!inserted) {
                auto& diag = scope.addDiag(diag::CoverageOptionDup, syntax.expr->sourceRange());
                diag << name;
                diag.addNote(diag::NotePreviousUsage, it->second->getFirstToken().location());
            }
        }
    }